

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_WienerDenoiseTest_::InvalidBlockSize<BitDepthParams<unsigned_short,_10,_true>_>::
TestBody(InvalidBlockSize<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long in_RDI;
  int *in_stack_00000038;
  int *in_stack_00000040;
  int in_stack_00000048;
  int in_stack_0000004c;
  uint8_t **in_stack_00000050;
  uint8_t **in_stack_00000058;
  AssertionResult gtest_ar_2;
  float **in_stack_00000070;
  int in_stack_00000078;
  int in_stack_00000080;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint8_t *denoised_ptrs [3];
  uint8_t *data_ptrs [3];
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  Type type;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertionResult local_b8 [2];
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar7;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_58;
  reference local_48;
  reference local_40;
  reference local_38;
  reference local_28;
  reference local_20;
  reference local_18;
  
  type = (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_28 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x10),0
                       );
  local_20 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x28),0
                       );
  local_18 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x40),0
                       );
  local_48 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x58),0
                       );
  local_40 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x70),0
                       );
  local_38 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x88),0
                       );
  uVar4 = 0x12;
  uVar5 = 10;
  uVar6 = 1;
  aom_wiener_denoise_2d
            (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000048,
             in_stack_00000040,in_stack_00000038,in_stack_00000070,in_stack_00000078,
             in_stack_00000080,gtest_ar_1._0_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (char *)CONCAT44(in_stack_ffffffffffffff04,uVar6),
             (int *)CONCAT44(in_stack_fffffffffffffefc,uVar5),
             (int *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff20 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x5f6c3e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,type,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               (char *)CONCAT44(in_stack_ffffffffffffff04,uVar6));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,
               (Message *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
    testing::Message::~Message((Message *)0x5f6c9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f6d0c);
  uVar7 = 0;
  uVar4 = 0x30;
  uVar5 = 10;
  uVar6 = 1;
  iVar2 = aom_wiener_denoise_2d
                    (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000048,
                     in_stack_00000040,in_stack_00000038,in_stack_00000070,in_stack_00000078,
                     in_stack_00000080,gtest_ar_1._0_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (char *)CONCAT44(in_stack_ffffffffffffff04,uVar6),
             (int *)CONCAT44(in_stack_fffffffffffffefc,uVar5),
             (int *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x5f6de3);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,type,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               (char *)CONCAT44(in_stack_ffffffffffffff04,uVar6));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)CONCAT44(uVar7,iVar2));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
    testing::Message::~Message((Message *)0x5f6e31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f6e9c);
  uVar4 = 0x40;
  uVar5 = 10;
  uVar6 = 1;
  aom_wiener_denoise_2d
            (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000048,
             in_stack_00000040,in_stack_00000038,in_stack_00000070,in_stack_00000078,
             in_stack_00000080,gtest_ar_1._0_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (char *)CONCAT44(in_stack_ffffffffffffff04,uVar6),
             (int *)CONCAT44(in_stack_fffffffffffffefc,uVar5),
             (int *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x5f6f5e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,type,pcVar3,in_stack_ffffffffffffff0c,
               (char *)CONCAT44(in_stack_ffffffffffffff04,uVar6));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)CONCAT44(uVar7,iVar2));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
    testing::Message::~Message((Message *)0x5f6fac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f700e);
  return;
}

Assistant:

TYPED_TEST_P(WienerDenoiseTest, InvalidBlockSize) {
  const uint8_t *const data_ptrs[3] = {
    reinterpret_cast<uint8_t *>(&this->data_[0][0]),
    reinterpret_cast<uint8_t *>(&this->data_[1][0]),
    reinterpret_cast<uint8_t *>(&this->data_[2][0]),
  };
  uint8_t *denoised_ptrs[3] = {
    reinterpret_cast<uint8_t *>(&this->denoised_[0][0]),
    reinterpret_cast<uint8_t *>(&this->denoised_[1][0]),
    reinterpret_cast<uint8_t *>(&this->denoised_[2][0]),
  };
  EXPECT_EQ(0, aom_wiener_denoise_2d(data_ptrs, denoised_ptrs, this->kWidth,
                                     this->kHeight, this->stride_,
                                     this->chroma_sub_, this->noise_psd_ptrs_,
                                     18, this->kBitDepth, this->kUseHighBD));
  EXPECT_EQ(0, aom_wiener_denoise_2d(data_ptrs, denoised_ptrs, this->kWidth,
                                     this->kHeight, this->stride_,
                                     this->chroma_sub_, this->noise_psd_ptrs_,
                                     48, this->kBitDepth, this->kUseHighBD));
  EXPECT_EQ(0, aom_wiener_denoise_2d(data_ptrs, denoised_ptrs, this->kWidth,
                                     this->kHeight, this->stride_,
                                     this->chroma_sub_, this->noise_psd_ptrs_,
                                     64, this->kBitDepth, this->kUseHighBD));
}